

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O1

int Dau_DecCheckSetTopOld
              (word *p,int nVars,int nVarsF,int nVarsB,int nVarsS,int maskS,word **pCof0,
              word **pCof1,word **pDec)

{
  ulong uVar1;
  word *pwVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  word *pwVar7;
  word *pwVar8;
  ulong uVar9;
  int pVarsS [16];
  
  uVar5 = 1 << ((byte)nVarsS & 0x1f);
  if (0xd < nVars - 3U) {
    __assert_fail("nVars >= 3 && nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12d,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if (nVarsB + nVarsF != nVars) {
    __assert_fail("nVars == nVarsF + nVarsB",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12e,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if ((nVarsF < 1) || (nVars + -2 < nVarsF)) {
    __assert_fail("nVarsF >= 1 && nVarsF <= nVars - 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x12f,
                  "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                 );
  }
  if ((1 < nVarsB) && (nVarsB < nVars)) {
    if ((nVarsS < 0) || (nVarsB + -2 < nVarsS)) {
      __assert_fail("nVarsS >= 0 && nVarsS <= nVarsB - 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                    ,0x131,
                    "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                   );
    }
    if (nVarsS == 0) {
      if (pCof0 == (word **)0x0) {
        pwVar7 = (word *)0x0;
      }
      else {
        pwVar7 = *pCof0;
      }
      if (pCof1 == (word **)0x0) {
        pwVar2 = (word *)0x0;
      }
      else {
        pwVar2 = *pCof1;
      }
      if (pDec == (word **)0x0) {
        pwVar8 = (word *)0x0;
      }
      else {
        pwVar8 = *pDec;
      }
      iVar6 = Dau_DecCheckSetAny(p,nVars,nVarsF,0,0,pwVar7,pwVar2,pwVar8);
    }
    else {
      if ((maskS < 1) || (1 << ((byte)nVarsB & 0x1f) <= maskS)) {
        __assert_fail("maskS > 0 && maskS < (1 << nVarsB)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                      ,0x135,
                      "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                     );
      }
      uVar3 = 0;
      iVar6 = 0;
      do {
        if (((uint)maskS >> (uVar3 & 0x1f) & 1) != 0) {
          lVar4 = (long)iVar6;
          iVar6 = iVar6 + 1;
          pVarsS[lVar4] = uVar3;
        }
        uVar3 = uVar3 + 1;
      } while (nVarsB != uVar3);
      if (iVar6 != nVarsS) {
        __assert_fail("i == nVarsS",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                      ,0x139,
                      "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                     );
      }
      iVar6 = 1;
      if (nVarsS != 0x1f) {
        if (nVarsS < 2) {
          nVarsS = 1;
        }
        uVar3 = 1;
        if (1 < (int)uVar5) {
          uVar3 = uVar5;
        }
        uVar9 = 0;
        do {
          uVar1 = 0;
          uVar5 = 0;
          do {
            if (((uint)uVar9 >> ((uint)uVar1 & 0x1f) & 1) != 0) {
              uVar5 = uVar5 | 1 << (*(byte *)(pVarsS + uVar1) & 0x1f);
            }
            uVar1 = uVar1 + 1;
          } while ((uint)nVarsS != uVar1);
          if ((uVar5 & ~maskS) != 0) {
            __assert_fail("(maskS & uMaskValue) == uMaskValue",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                          ,0x142,
                          "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
                         );
          }
          if (pCof0 == (word **)0x0) {
            pwVar7 = (word *)0x0;
          }
          else {
            pwVar7 = pCof0[uVar9];
          }
          if (pCof1 == (word **)0x0) {
            pwVar2 = (word *)0x0;
          }
          else {
            pwVar2 = pCof1[uVar9];
          }
          if (pDec == (word **)0x0) {
            pwVar8 = (word *)0x0;
          }
          else {
            pwVar8 = pDec[uVar9];
          }
          iVar6 = Dau_DecCheckSetAny(p,nVars,nVarsF,maskS,uVar5,pwVar7,pwVar2,pwVar8);
          if (iVar6 == 0) {
            return 0;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar3);
        iVar6 = 1;
      }
    }
    return iVar6;
  }
  __assert_fail("nVarsB >= 2 && nVarsB <= nVars - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                ,0x130,
                "int Dau_DecCheckSetTopOld(word *, int, int, int, int, int, word **, word **, word **)"
               );
}

Assistant:

int Dau_DecCheckSetTopOld( word * p, int nVars, int nVarsF, int nVarsB, int nVarsS, int maskS, word ** pCof0, word ** pCof1, word ** pDec )
{
    int i, pVarsS[16];
    int v, m, mMax = (1 << nVarsS), uMaskValue;
    assert( nVars >= 3 && nVars <= 16 );
    assert( nVars == nVarsF + nVarsB );
    assert( nVarsF >= 1 && nVarsF <= nVars - 2 );
    assert( nVarsB >= 2 && nVarsB <= nVars - 1 );
    assert( nVarsS >= 0 && nVarsS <= nVarsB - 2 );
    if ( nVarsS == 0 )
        return Dau_DecCheckSetAny( p, nVars, nVarsF, 0, 0, pCof0? pCof0[0] : 0, pCof1? pCof1[0] : 0, pDec? pDec[0] : 0 );
    // collect shared variables
    assert( maskS > 0 && maskS < (1 << nVarsB) );
    for ( i = 0, v = 0; v < nVarsB; v++ )
        if ( (maskS >> v) & 1 )
            pVarsS[i++] = v;
    assert( i == nVarsS );
    // go through shared set minterms
    for ( m = 0; m < mMax; m++ )
    {
        // generate share set mask
        uMaskValue = 0;
        for ( v = 0; v < nVarsS; v++ )
            if ( (m >> v) & 1 )
                uMaskValue |= (1 << pVarsS[v]);
        assert( (maskS & uMaskValue) == uMaskValue );
        // check decomposition
        if ( !Dau_DecCheckSetAny( p, nVars, nVarsF, maskS, uMaskValue, pCof0? pCof0[m] : 0, pCof1? pCof1[m] : 0, pDec? pDec[m] : 0 ) )
            return 0;
    }
   return 1;
}